

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall cmsys::CommandLineArguments::GenerateHelp(CommandLineArguments *this)

{
  _Rb_tree_node_base *p_Var1;
  char *pcVar2;
  iterator iVar3;
  _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
  *p_Var4;
  _Base_ptr p_Var5;
  Internal *pIVar6;
  iterator __position;
  _Base_ptr p_Var7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  ostream *poVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  _Self __tmp_2;
  undefined1 *puVar14;
  ulong uVar15;
  ulong uVar16;
  _Self __tmp;
  _Base_ptr p_Var17;
  int iVar18;
  _Self __tmp_1;
  char *__s;
  string argument;
  _Self __tmp_4;
  MapArgs mp;
  string local_1c8 [32];
  ostringstream str;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  mp._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mp._M_t._M_impl.super__Rb_tree_header._M_header;
  mp._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mp._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pIVar6 = this->Internals;
  p_Var5 = *(_Base_ptr *)
            ((long)&(pIVar6->Callbacks).
                    super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  mp._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mp._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var5 !=
         &(pIVar6->Callbacks).
          super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
          ._M_t._M_impl.super__Rb_tree_header) {
    String::String((String *)&argument,(value_type *)p_Var5[3]._M_left);
    iVar3 = std::
            _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
            ::find(&mp._M_t,(key_type *)&argument);
    p_Var1 = p_Var5 + 1;
    std::__cxx11::string::~string((string *)&argument);
    if ((_Rb_tree_header *)iVar3._M_node != &mp._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
      ::_M_insert_unique<cmsys::String_const&>
                ((_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                  *)(iVar3._M_node + 2),(String *)p_Var1);
    }
    p_Var4 = (_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
              *)std::
                map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                ::operator[]((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                              *)&mp._M_t,(key_type *)p_Var1);
    std::
    _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
    ::_M_insert_unique<cmsys::String_const&>(p_Var4,(String *)p_Var1);
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    pIVar6 = this->Internals;
  }
  p_Var5 = *(_Base_ptr *)
            ((long)&(pIVar6->Callbacks).
                    super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  while ((_Rb_tree_header *)p_Var5 !=
         &(pIVar6->Callbacks).
          super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
          ._M_t._M_impl.super__Rb_tree_header) {
    String::String((String *)&argument,(value_type *)p_Var5[3]._M_left);
    iVar3 = std::
            _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
            ::find((_Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                    *)&mp,(key_type *)&argument);
    p_Var1 = p_Var5 + 1;
    std::__cxx11::string::~string((string *)&argument);
    if ((_Rb_tree_header *)iVar3._M_node == &mp._M_t._M_impl.super__Rb_tree_header) {
      p_Var4 = (_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                *)std::
                  map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                  ::operator[]((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                                *)&mp,(key_type *)p_Var1);
      std::
      _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
      ::_M_insert_unique<cmsys::String_const&>(p_Var4,(String *)p_Var1);
    }
    else {
      std::
      _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
      ::_M_insert_unique<cmsys::String_const&>
                ((_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                  *)(iVar3._M_node + 2),(String *)p_Var1);
      __position = std::
                   _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                   ::find((_Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                           *)&mp,(key_type *)p_Var1);
      for (p_Var7 = __position._M_node[2]._M_right;
          p_Var7 != (_Base_ptr)&__position._M_node[2]._M_parent;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        std::
        _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
        ::_M_insert_unique<cmsys::String_const&>
                  ((_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                    *)(iVar3._M_node + 2),(String *)(p_Var7 + 1));
      }
      std::
      _Rb_tree<cmsys::String,std::pair<cmsys::String_const,cmsys::CommandLineArgumentsSetOfStrings>,std::_Select1st<std::pair<cmsys::String_const,cmsys::CommandLineArgumentsSetOfStrings>>,std::less<cmsys::String>,std::allocator<std::pair<cmsys::String_const,cmsys::CommandLineArgumentsSetOfStrings>>>
      ::erase_abi_cxx11_((_Rb_tree<cmsys::String,std::pair<cmsys::String_const,cmsys::CommandLineArgumentsSetOfStrings>,std::_Select1st<std::pair<cmsys::String_const,cmsys::CommandLineArgumentsSetOfStrings>>,std::less<cmsys::String>,std::allocator<std::pair<cmsys::String_const,cmsys::CommandLineArgumentsSetOfStrings>>>
                          *)&mp,__position);
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    pIVar6 = this->Internals;
  }
  p_Var7 = (_Base_ptr)0x0;
  for (p_Var5 = mp._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &mp._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    for (p_Var9 = p_Var5[2]._M_right; p_Var9 != (_Base_ptr)&p_Var5[2]._M_parent;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      p_Var17 = p_Var9[1]._M_parent;
      pmVar8 = std::
               map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
               ::operator[](&(this->Internals->Callbacks).
                             super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                            ,(key_type *)(p_Var9 + 1));
      iVar18 = pmVar8->ArgumentType;
      if (iVar18 == 1) {
        p_Var17 = (_Base_ptr)((long)&p_Var17->_M_color + 3);
      }
      else if ((iVar18 == 2) || (iVar18 == 3)) {
        p_Var17 = (_Base_ptr)&p_Var17->field_0x4;
      }
      if (p_Var7 < p_Var17) {
        p_Var7 = p_Var17;
      }
    }
  }
  p_Var5 = mp._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var5 == &mp._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&this->Help,(string *)&argument);
      std::__cxx11::string::~string((string *)&argument);
      std::
      _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
      ::~_Rb_tree(&mp._M_t);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
      return;
    }
    for (p_Var9 = p_Var5[2]._M_right; p_Var9 != (_Base_ptr)&p_Var5[2]._M_parent;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      std::endl<char,std::char_traits<char>>((ostream *)&str);
      std::__cxx11::string::string((string *)&argument,(string *)(p_Var9 + 1));
      pmVar8 = std::
               map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
               ::operator[](&(this->Internals->Callbacks).
                             super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                            ,(key_type *)(p_Var9 + 1));
      if (pmVar8->ArgumentType - 1U < 4) {
        std::__cxx11::string::append((char *)&argument);
      }
      poVar10 = std::operator<<((ostream *)&str,"  ");
      std::__cxx11::string::substr((ulong)local_1c8,(ulong)&argument);
      poVar10 = std::operator<<(poVar10,local_1c8);
      std::operator<<(poVar10,"  ");
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string((string *)&argument);
    }
    pmVar8 = std::
             map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
             ::operator[](&(this->Internals->Callbacks).
                           super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                          ,(key_type *)(p_Var5 + 1));
    __s = pmVar8->Help;
    sVar11 = strlen(__s);
    iVar18 = 0;
    for (; sVar11 != 0; sVar11 = sVar11 - uVar16) {
      for (lVar12 = 0; __s[lVar12] != '\0'; lVar12 = lVar12 + 1) {
        if ((*__s == ' ') || (*__s == '\t')) {
          __s = __s + 1;
          sVar11 = sVar11 - 1;
        }
      }
      puVar14 = &p_Var7->field_0x4;
      if (iVar18 != 0) {
        while (puVar14 != (undefined1 *)0x0) {
          std::operator<<((ostream *)&str," ");
          puVar14 = puVar14 + -1;
        }
      }
      uVar13 = (ulong)this->LineLength - (long)&p_Var7->field_0x4;
      uVar16 = sVar11;
      if (uVar13 < sVar11) {
        uVar15 = (ulong)this->LineLength + (-5 - (long)p_Var7);
        do {
          uVar16 = uVar13;
          if ((uVar15 == 0) || (pcVar2 = __s + uVar15, uVar16 = uVar15, *pcVar2 == ' ')) break;
          uVar15 = uVar15 - 1;
        } while (*pcVar2 != '\t');
      }
      std::ostream::write((char *)&str,(long)__s);
      std::endl<char,std::char_traits<char>>((ostream *)&str);
      __s = __s + uVar16;
      iVar18 = iVar18 + 1;
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

void CommandLineArguments::GenerateHelp()
{
  std::ostringstream str;

  // Collapse all arguments into the map of vectors of all arguments that do
  // the same thing.
  CommandLineArguments::Internal::CallbacksMap::iterator it;
  using MapArgs = std::map<CommandLineArguments::Internal::String,
                           CommandLineArguments::Internal::SetOfStrings>;
  MapArgs mp;
  MapArgs::iterator mpit, smpit;
  for (it = this->Internals->Callbacks.begin();
       it != this->Internals->Callbacks.end(); it++) {
    CommandLineArgumentsCallbackStructure* cs = &(it->second);
    mpit = mp.find(cs->Help);
    if (mpit != mp.end()) {
      mpit->second.insert(it->first);
      mp[it->first].insert(it->first);
    } else {
      mp[it->first].insert(it->first);
    }
  }
  for (it = this->Internals->Callbacks.begin();
       it != this->Internals->Callbacks.end(); it++) {
    CommandLineArgumentsCallbackStructure* cs = &(it->second);
    mpit = mp.find(cs->Help);
    if (mpit != mp.end()) {
      mpit->second.insert(it->first);
      smpit = mp.find(it->first);
      CommandLineArguments::Internal::SetOfStrings::iterator sit;
      for (sit = smpit->second.begin(); sit != smpit->second.end(); sit++) {
        mpit->second.insert(*sit);
      }
      mp.erase(smpit);
    } else {
      mp[it->first].insert(it->first);
    }
  }

  // Find the length of the longest string
  CommandLineArguments::Internal::String::size_type maxlen = 0;
  for (mpit = mp.begin(); mpit != mp.end(); mpit++) {
    CommandLineArguments::Internal::SetOfStrings::iterator sit;
    for (sit = mpit->second.begin(); sit != mpit->second.end(); sit++) {
      CommandLineArguments::Internal::String::size_type clen = sit->size();
      switch (this->Internals->Callbacks[*sit].ArgumentType) {
        case CommandLineArguments::NO_ARGUMENT:
          clen += 0;
          break;
        case CommandLineArguments::CONCAT_ARGUMENT:
          clen += 3;
          break;
        case CommandLineArguments::SPACE_ARGUMENT:
          clen += 4;
          break;
        case CommandLineArguments::EQUAL_ARGUMENT:
          clen += 4;
          break;
      }
      if (clen > maxlen) {
        maxlen = clen;
      }
    }
  }

  CommandLineArguments::Internal::String::size_type maxstrlen = maxlen;
  maxlen += 4; // For the space before and after the option

  // Print help for each option
  for (mpit = mp.begin(); mpit != mp.end(); mpit++) {
    CommandLineArguments::Internal::SetOfStrings::iterator sit;
    for (sit = mpit->second.begin(); sit != mpit->second.end(); sit++) {
      str << std::endl;
      std::string argument = *sit;
      switch (this->Internals->Callbacks[*sit].ArgumentType) {
        case CommandLineArguments::NO_ARGUMENT:
          break;
        case CommandLineArguments::CONCAT_ARGUMENT:
          argument += "opt";
          break;
        case CommandLineArguments::SPACE_ARGUMENT:
          argument += " opt";
          break;
        case CommandLineArguments::EQUAL_ARGUMENT:
          argument += "=opt";
          break;
        case CommandLineArguments::MULTI_ARGUMENT:
          argument += " opt opt ...";
          break;
      }
      str << "  " << argument.substr(0, maxstrlen) << "  ";
    }
    const char* ptr = this->Internals->Callbacks[mpit->first].Help;
    size_t len = strlen(ptr);
    int cnt = 0;
    while (len > 0) {
      // If argument with help is longer than line length, split it on previous
      // space (or tab) and continue on the next line
      CommandLineArguments::Internal::String::size_type cc;
      for (cc = 0; ptr[cc]; cc++) {
        if (*ptr == ' ' || *ptr == '\t') {
          ptr++;
          len--;
        }
      }
      if (cnt > 0) {
        for (cc = 0; cc < maxlen; cc++) {
          str << " ";
        }
      }
      CommandLineArguments::Internal::String::size_type skip = len;
      if (skip > this->LineLength - maxlen) {
        skip = this->LineLength - maxlen;
        for (cc = skip - 1; cc > 0; cc--) {
          if (ptr[cc] == ' ' || ptr[cc] == '\t') {
            break;
          }
        }
        if (cc != 0) {
          skip = cc;
        }
      }
      str.write(ptr, static_cast<std::streamsize>(skip));
      str << std::endl;
      ptr += skip;
      len -= skip;
      cnt++;
    }
  }
  /*
  // This can help debugging help string
  str << endl;
  unsigned int cc;
  for ( cc = 0; cc < this->LineLength; cc ++ )
    {
    str << cc % 10;
    }
  str << endl;
  */
  this->Help = str.str();
}